

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::throw_statement::~throw_statement(throw_statement *this)

{
  ~throw_statement(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit throw_statement(const source_extend& extend, expression_ptr&& e) : statement(extend), e_(std::move(e)) {
        assert(e_);
    }